

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O0

wstring * __thiscall
mjs::regexp_flags_to_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,regexp_flag flags)

{
  regexp_flag rVar1;
  regexp_flag l;
  wchar_t wVar2;
  regexp_flag flags_local;
  wstring *res;
  
  l = (regexp_flag)this;
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  rVar1 = operator&(l,global);
  wVar2 = (wchar_t)__return_storage_ptr__;
  if (rVar1 != none) {
    std::__cxx11::wstring::push_back(wVar2);
  }
  rVar1 = operator&(l,ignore_case);
  if (rVar1 != none) {
    std::__cxx11::wstring::push_back(wVar2);
  }
  rVar1 = operator&(l,multiline);
  if (rVar1 != none) {
    std::__cxx11::wstring::push_back(wVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring regexp_flags_to_string(regexp_flag flags) {
    std::wstring res;
    if ((flags & regexp_flag::global) != regexp_flag::none)      res.push_back('g');
    if ((flags & regexp_flag::ignore_case) != regexp_flag::none) res.push_back('i');
    if ((flags & regexp_flag::multiline) != regexp_flag::none)   res.push_back('m');
    return res;
}